

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O0

void free_extra_descr(EXTRA_DESCR_DATA *ed)

{
  EXTRA_DESCR_DATA *in_RDI;
  
  if ((in_RDI != (EXTRA_DESCR_DATA *)0x0) && ((in_RDI->valid & 1U) != 0)) {
    free_pstring((char *)ed);
    free_pstring((char *)ed);
    in_RDI->valid = false;
    in_RDI->next = extra_descr_free;
    extra_descr_free = in_RDI;
  }
  return;
}

Assistant:

void free_extra_descr(EXTRA_DESCR_DATA *ed)
{
	if (!(ed != nullptr && ed->valid))
		return;

	free_pstring(ed->keyword);
	free_pstring(ed->description);

	ed->valid = false;
	ed->next = extra_descr_free;
	extra_descr_free = ed;
}